

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpServer.cpp
# Opt level: O2

void __thiscall sznet::net::KcpWithTcpServer::setThreadNum(KcpWithTcpServer *this,int numThreads)

{
  uint __line;
  char *__assertion;
  
  if (numThreads < 0) {
    __assertion = "0 <= numThreads";
    __line = 0x2d;
  }
  else {
    if (((long)(this->m_udpListenAddrs).
               super__Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->m_udpListenAddrs).
              super__Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>.
              _M_impl.super__Vector_impl_data._M_start) / 0x1c == (ulong)(uint)numThreads) {
      ((this->m_threadPool).
       super___shared_ptr<sznet::net::KcpTcpEventLoopThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->m_numThreads = numThreads;
      return;
    }
    __assertion = "m_udpListenAddrs.size() == numThreads";
    __line = 0x2e;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpServer.cpp"
                ,__line,"void sznet::net::KcpWithTcpServer::setThreadNum(int)");
}

Assistant:

void KcpWithTcpServer::setThreadNum(int numThreads)
{
	assert(0 <= numThreads);
	assert(m_udpListenAddrs.size() == numThreads);
	m_threadPool->setThreadNum(numThreads);
}